

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O0

string_type * __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_quote_meta<char_const*>
          (regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           *this,char **begin,char *end)

{
  compiler_token_type cVar1;
  undefined8 in_RCX;
  long *in_RDX;
  char *in_RSI;
  string_type *in_RDI;
  error_type unaff_retaddr;
  undefined1 unaff_retaddr_00;
  char *old_end;
  char *old_begin;
  allocator<char> *in_stack_ffffffffffffff78;
  allocator<char> *__a;
  char **in_stack_ffffffffffffff80;
  char *__end;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_stack_ffffffffffffff88;
  char *__beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  char *local_30;
  char *local_28;
  string_type *msg;
  
  local_28 = (char *)*in_RDX;
  msg = in_RDI;
  do {
    local_30 = (char *)*in_RDX;
    if ((char *)in_RCX == local_30) {
      __a = local_45;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                 (char *)in_stack_ffffffffffffff80,__a);
      std::allocator<char>::~allocator(local_45);
      return in_RDI;
    }
    cVar1 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::get_token<char_const*>
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                       (char *)in_stack_ffffffffffffff78);
    switch(cVar1) {
    default:
      break;
    case token_escape:
      detail::ensure_((bool)unaff_retaddr_00,unaff_retaddr,(char *)msg,in_RSI,(char *)in_RDX,in_RCX)
      ;
    case token_literal:
    case token_invalid_quantifier:
      *in_RDX = *in_RDX + 1;
      break;
    case token_quote_meta_end:
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_31;
      __end = local_28;
      __beg = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(this_00,__beg,__end,in_stack_ffffffffffffff78);
      std::allocator<char>::~allocator(&local_31);
      return in_RDI;
    }
  } while( true );
}

Assistant:

string_type parse_quote_meta(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        FwdIter old_begin = begin, old_end;
        while(end != (old_end = begin))
        {
            switch(this->traits_.get_token(begin, end))
            {
            case token_quote_meta_end:
                return string_type(old_begin, old_end);
            case token_escape:
                BOOST_XPR_ENSURE_(begin != end, error_escape, "incomplete escape sequence");
                BOOST_FALLTHROUGH;
            case token_invalid_quantifier:
            case token_literal:
                ++begin;
                break;
            default:
                break;
            }
        }
        return string_type(old_begin, begin);
    }